

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

Variable __thiscall
LiteScript::CreateVariable
          (LiteScript *this,Memory *memory,
          _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
          *value)

{
  Object *pOVar1;
  uint *extraout_RDX;
  Variable VVar2;
  Callback CStack_c8;
  
  Memory::Create((Memory *)this,(Type *)memory);
  Callback::Callback(&CStack_c8,memory,value);
  pOVar1 = Variable::operator->((Variable *)this);
  Callback::operator=((Callback *)pOVar1->data,&CStack_c8);
  Callback::~Callback(&CStack_c8);
  VVar2.nb_ref = extraout_RDX;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, Variable (* value)(State &, std::vector<Variable> &)) {
    Variable v = memory.Create(Type::CALLBACK);
    v->GetData<Callback>() = Callback(memory, value);
    return v;
}